

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_bit_stream.cpp
# Opt level: O2

void BuildAndStoreBlockSwitchEntropyCodes
               (BlockEncoder *self,HuffmanTree *tree,size_t *storage_ix,uint8_t *storage)

{
  uint8_t *depth;
  uint16_t *bits;
  byte bVar1;
  ushort uVar2;
  uint uVar3;
  byte *pbVar4;
  uint *puVar5;
  size_t sVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  size_t sVar11;
  ulong uVar12;
  ulong uVar13;
  uint32_t local_4a8 [28];
  uint32_t type_histo [258];
  
  uVar9 = self->num_block_types_;
  pbVar4 = self->block_types_;
  puVar5 = self->block_lengths_;
  sVar6 = self->num_blocks_;
  switchD_0049f7f1::default(type_histo,0,uVar9 * 4 + 8);
  local_4a8[0] = 0;
  local_4a8[1] = 0;
  local_4a8[2] = 0;
  local_4a8[3] = 0;
  local_4a8[4] = 0;
  local_4a8[5] = 0;
  local_4a8[6] = 0;
  local_4a8[7] = 0;
  local_4a8[8] = 0;
  local_4a8[9] = 0;
  local_4a8[10] = 0;
  local_4a8[0xb] = 0;
  local_4a8[0xc] = 0;
  local_4a8[0xd] = 0;
  local_4a8[0xe] = 0;
  local_4a8[0xf] = 0;
  local_4a8[0x10] = 0;
  local_4a8[0x11] = 0;
  local_4a8[0x12] = 0;
  local_4a8[0x13] = 0;
  local_4a8[0x14] = 0;
  local_4a8[0x15] = 0;
  local_4a8[0x16] = 0;
  local_4a8[0x17] = 0;
  local_4a8[0x18] = 0;
  local_4a8[0x19] = 0;
  uVar10 = 1;
  uVar13 = 0;
  for (sVar11 = 0; uVar8 = uVar10, sVar11 != sVar6; sVar11 = sVar11 + 1) {
    bVar1 = pbVar4[sVar11];
    uVar10 = (ulong)bVar1;
    if (sVar11 != 0) {
      uVar3 = bVar1 + 2;
      if (uVar13 == uVar10) {
        uVar3 = 0;
      }
      uVar13 = (ulong)uVar3;
      if (uVar8 + 1 == uVar10) {
        uVar13 = 1;
      }
      type_histo[uVar13] = type_histo[uVar13] + 1;
    }
    uVar3 = puVar5[sVar11];
    uVar13 = 0xe;
    if (0x2f0 < uVar3) {
      uVar13 = 0x14;
    }
    uVar12 = 0;
    if (0x28 < uVar3) {
      uVar12 = 7;
    }
    if (0xb0 < uVar3) {
      uVar12 = uVar13;
    }
    do {
      uVar13 = 0x19;
      if (0x18 < uVar12) break;
      lVar7 = uVar12 * 2;
      uVar13 = uVar12;
      uVar12 = uVar12 + 1;
    } while ((ushort)(&DAT_010d70f4)[lVar7] <= uVar3);
    local_4a8[uVar13] = local_4a8[uVar13] + 1;
    uVar13 = uVar8;
  }
  StoreVarLenUint8(uVar9 - 1,storage_ix,storage);
  if (1 < uVar9) {
    BuildAndStoreHuffmanTree
              (type_histo,uVar9 + 2,uVar9 + 2,tree,(self->block_split_code_).type_depths,
               (self->block_split_code_).type_bits,storage_ix,storage);
    depth = (self->block_split_code_).length_depths;
    bits = (self->block_split_code_).length_bits;
    BuildAndStoreHuffmanTree(local_4a8,0x1a,0x1a,tree,depth,bits,storage_ix,storage);
    uVar3 = *puVar5;
    bVar1 = *pbVar4;
    (self->block_split_code_).type_code_calculator.second_last_type =
         (self->block_split_code_).type_code_calculator.last_type;
    (self->block_split_code_).type_code_calculator.last_type = (ulong)bVar1;
    uVar9 = 0xe;
    if (0x2f0 < uVar3) {
      uVar9 = 0x14;
    }
    uVar10 = 0;
    if (0x28 < uVar3) {
      uVar10 = 7;
    }
    if (0xb0 < uVar3) {
      uVar10 = uVar9;
    }
    do {
      uVar9 = 0x19;
      if (0x18 < uVar10) break;
      lVar7 = uVar10 * 2;
      uVar9 = uVar10;
      uVar10 = uVar10 + 1;
    } while ((ushort)(&DAT_010d70f4)[lVar7] <= uVar3);
    bVar1 = (&DAT_010d70f2)[uVar9 * 4];
    uVar2 = (&duckdb_brotli::_kBrotliPrefixCodeRanges)[uVar9 * 2];
    uVar10 = *storage_ix;
    uVar13 = depth[uVar9] + uVar10;
    *(ulong *)(storage + (uVar10 >> 3)) =
         (ulong)bits[uVar9] << ((byte)uVar10 & 7) | (ulong)storage[uVar10 >> 3];
    *storage_ix = uVar13;
    *(ulong *)(storage + (uVar13 >> 3)) =
         (ulong)(uVar3 - uVar2) << ((byte)uVar13 & 7) | (ulong)storage[uVar13 >> 3];
    *storage_ix = uVar13 + bVar1;
  }
  return;
}

Assistant:

static void BuildAndStoreBlockSwitchEntropyCodes(BlockEncoder* self,
    HuffmanTree* tree, size_t* storage_ix, uint8_t* storage) {
  BuildAndStoreBlockSplitCode(self->block_types_, self->block_lengths_,
      self->num_blocks_, self->num_block_types_, tree, &self->block_split_code_,
      storage_ix, storage);
}